

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O1

bool __thiscall Trie::findLongestPrefix(Trie *this,char *text,size_t *result)

{
  _Rb_tree_header *p_Var1;
  pointer pNVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  LookupEntry lookupEntry;
  key_type local_40;
  
  p_Var1 = &(this->lookup)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (_Base_ptr)0x0;
  p_Var4 = (_Base_ptr)0x0;
  do {
    local_40.input = *text;
    if (local_40.input == '\0') break;
    if ((this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
        super__Vector_impl_data._M_start[(long)p_Var5].hasValue != false) {
      p_Var4 = p_Var5;
    }
    local_40.node = (size_t)p_Var5;
    iVar3 = std::
            _Rb_tree<Trie::LookupEntry,_std::pair<const_Trie::LookupEntry,_unsigned_long>,_std::_Select1st<std::pair<const_Trie::LookupEntry,_unsigned_long>_>,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
            ::find(&(this->lookup)._M_t,&local_40);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      p_Var5 = iVar3._M_node[1]._M_left;
    }
    text = text + 1;
  } while ((_Rb_tree_header *)iVar3._M_node != p_Var1);
  pNVar2 = (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pNVar2[(long)p_Var5].hasValue != false) {
    p_Var4 = p_Var5;
  }
  *result = pNVar2[(long)p_Var4].value;
  return pNVar2[(long)p_Var4].hasValue;
}

Assistant:

bool Trie::findLongestPrefix(const char* text, size_t& result)
{
	size_t node = 0;		// root node
	size_t valueNode = 0;	// remember last node that had a value

	while (*text != 0)
	{
		if (nodes[node].hasValue)
			valueNode = node;

		LookupEntry lookupEntry { node, *text++ };
		auto it = lookup.find(lookupEntry);
		
		if (it == lookup.end())
			break;

		node = it->second;
	}
	
	if (nodes[node].hasValue)
		valueNode = node;

	result = nodes[valueNode].value;
	return nodes[valueNode].hasValue;
}